

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::AddProperty
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  Var value_00;
  DynamicObject *pDVar3;
  ScriptContext *scriptContext;
  uint uVar4;
  bool bVar5;
  BOOL BVar6;
  int iVar7;
  undefined4 *puVar8;
  PathTypeHandlerBase *pPVar9;
  PropertyRecord *pPVar10;
  SimpleDictionaryTypeHandler *this_00;
  undefined7 in_register_00000081;
  PropertyAttributes attributes_00;
  uint32 local_6c;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> WStack_68;
  uint32 indexVal;
  Var local_60;
  PropertyIndex local_56;
  uint local_54;
  PropertyIndex index;
  DynamicObject *pDStack_50;
  PropertyValueInfo *local_48;
  ScriptContext *local_40;
  uint local_34;
  
  local_34 = (uint)CONCAT71(in_register_00000081,attributes);
  local_40 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  pJVar1 = (local_40->super_ScriptContextBase).javascriptLibrary;
  pDStack_50 = instance;
  local_48 = info;
  BVar6 = GetDescriptor(this,propertyId,&local_56);
  if (BVar6 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x451,"(!GetDescriptor(propertyId, &index))",
                                "!GetDescriptor(propertyId, &index)");
    if (!bVar5) goto LAB_00cc3997;
    *puVar8 = 0;
  }
  BVar6 = ScriptContext::IsNumericPropertyId(local_40,propertyId,&local_6c);
  if (BVar6 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x452,
                                "(!scriptContext->IsNumericPropertyId(propertyId, &indexVal))",
                                "!scriptContext->IsNumericPropertyId(propertyId, &indexVal)");
    if (!bVar5) goto LAB_00cc3997;
    *puVar8 = 0;
  }
  if (this->propertyCount == 0) {
    local_60 = value;
    pPVar10 = ScriptContext::GetPropertyName(local_40,propertyId);
    Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierSet
              (&this->descriptors[this->propertyCount].Id,pPVar10);
    uVar4 = local_34;
    attributes_00 = (PropertyAttributes)local_34;
    this->descriptors[this->propertyCount].field_1.Attributes = attributes_00;
    if ((local_34 & 1) != 0) {
      DynamicObject::SetHasNoEnumerableProperties(pDStack_50,false);
    }
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
    WriteBarrierSet((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                    &stack0xffffffffffffff98,&pJVar1->typesWithOnlyWritablePropertyProtoChain);
    scriptContext = local_40;
    local_54 = uVar4 & 0xff;
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)WStack_68.ptr,
               &this->super_DynamicTypeHandler,attributes_00,propertyId,local_40);
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
              (&stack0xffffffffffffff98,&pJVar1->typesWithNoSpecialPropertyProtoChain);
    PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<int>
              (WStack_68.ptr,&this->super_DynamicTypeHandler,(PropertyAttributes)local_54,propertyId
               ,scriptContext);
    pDVar3 = pDStack_50;
    value_00 = local_60;
    DynamicTypeHandler::SetSlotUnchecked(pDStack_50,this->propertyCount,local_60);
    iVar7 = this->propertyCount;
    if (local_48 != (PropertyValueInfo *)0x0) {
      local_48->m_instance = &pDVar3->super_RecyclableObject;
      local_48->m_propertyIndex = (PropertyIndex)iVar7;
      local_48->m_attributes = (PropertyAttributes)local_34;
      local_48->flags = InlineCacheNoFlags;
    }
    this->propertyCount = iVar7 + 1;
    if (((this->super_DynamicTypeHandler).flags != '\0') ||
       (BVar6 = JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                          (&pDVar3->super_RecyclableObject,propertyId), BVar6 != 0)) {
      ScriptContext::InvalidateProtoCaches(local_40,propertyId);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,pDVar3,propertyId,value_00,possibleSideEffects);
    return 1;
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x457,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar5) {
LAB_00cc3997:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  pDVar3 = pDStack_50;
  bVar5 = DoConvertToPathType((DynamicType *)(pDStack_50->super_RecyclableObject).type.ptr);
  if (bVar5) {
    pPVar9 = ConvertToPathType(this,pDVar3);
    iVar7 = (*(pPVar9->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                      (pPVar9,pDVar3,(ulong)(uint)propertyId,value,(ulong)(byte)local_34,local_48,
                       (ulong)flags,0xf);
    return iVar7;
  }
  pPVar10 = ScriptContext::GetPropertyName(local_40,propertyId);
  this_00 = ConvertToSimpleDictionaryType(this,pDVar3);
  BVar6 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
          AddProperty<Js::PropertyRecord_const*>
                    ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                      *)this_00,pDVar3,pPVar10,value,(byte)local_34,local_48,flags,
                     possibleSideEffects);
  return BVar6;
}

Assistant:

BOOL SimpleTypeHandler<size>::AddProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();
#if DBG
        PropertyIndex index;
        uint32 indexVal;
        Assert(!GetDescriptor(propertyId, &index));
        Assert(!scriptContext->IsNumericPropertyId(propertyId, &indexVal));
#endif

        if (propertyCount >= sizeof(descriptors)/sizeof(SimplePropertyDescriptor))
        {
            Assert(propertyId != Constants::NoProperty);
            if (DoConvertToPathType(instance->GetDynamicType()))
            {
                return ConvertToPathType(instance)->SetPropertyWithAttributes(instance, propertyId, value, attributes, info, flags);
            }
            else
            {
                PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
                return ConvertToSimpleDictionaryType(instance)->AddProperty(instance, propertyRecord, value, attributes, info, flags, possibleSideEffects);
            }
        }

        descriptors[propertyCount].Id = scriptContext->GetPropertyName(propertyId);
        descriptors[propertyCount].Attributes = attributes;
        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);

        SetSlotUnchecked(instance, propertyCount, value);
        PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(propertyCount), attributes);
        propertyCount++;

        if ((this->GetFlags() && IsPrototypeFlag)
            || JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId))
        {
            scriptContext->InvalidateProtoCaches(propertyId);
        }
        SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
        return true;
    }